

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O0

int cmap_load(char *filename)

{
  long in_RDI;
  int err;
  char *in_stack_00000158;
  undefined4 local_4;
  
  local_4 = cmap_load_internal(in_stack_00000158);
  if (local_4 == 0) {
    if (in_RDI != 0) {
      S_cmap_loaded = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cmap_load(char *filename)
{
    int err;
    
    /* try loading the file */
    if ((err = cmap_load_internal(filename)) != 0)
        return err;

    /* 
     *   note that we've explicitly loaded a character set, if they named
     *   a character set (if not, this simply establishes the default
     *   setting, so we haven't explicitly loaded anything) 
     */
    if (filename != 0)
        S_cmap_loaded = TRUE;

    /* success */
    return 0;
}